

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleTestApprovals.h
# Opt level: O2

void __thiscall
ApprovalTests::GoogleTestListener::OnTestStart(GoogleTestListener *this,TestInfo *testInfo)

{
  TestName *this_00;
  bool bVar1;
  string *psVar2;
  allocator local_a9;
  string local_a8;
  string local_88;
  string local_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  ::std::__cxx11::string::string
            ((string *)&local_a8,(testInfo->location_).file._M_dataplus._M_p,&local_a9);
  this_00 = &this->currentTest;
  TestName::setFileName(this_00,&local_a8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this_00->sections,
              (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               )ZEXT816(0));
  psVar2 = TestName::getFileName_abi_cxx11_(this_00);
  ::std::__cxx11::string::string((string *)&local_68,(string *)psVar2);
  ::std::__cxx11::string::string
            ((string *)&local_88,(testInfo->test_case_name_)._M_dataplus._M_p,(allocator *)&local_a8
            );
  bVar1 = isDuplicate(this,&local_68,&local_88);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  if (!bVar1) {
    local_a8._M_dataplus._M_p = (testInfo->test_case_name_)._M_dataplus._M_p;
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char **)&local_a8);
  }
  ::std::__cxx11::string::string((string *)&local_a8,(testInfo->name_)._M_dataplus._M_p,&local_a9);
  ::std::__cxx11::string::~string((string *)&local_a8);
  if (local_a8._M_string_length != 0) {
    local_a8._M_dataplus._M_p = (testInfo->name_)._M_dataplus._M_p;
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char **)&local_a8);
  }
  FrameworkIntegrations::setCurrentTest(this_00);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/google/GoogleTestApprovals.h:51:17)>
             ::_M_invoke;
  local_38 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/google/GoogleTestApprovals.h:51:17)>
             ::_M_manager;
  FrameworkIntegrations::setTestPassedNotification((TestPassedNotification *)&local_48);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

virtual void OnTestStart(const testing::TestInfo& testInfo) override
        {
            currentTest.setFileName(testInfo.file());
            currentTest.sections = {};
            if (!isDuplicate(currentTest.getFileName(), testInfo.test_case_name()))
            {
                currentTest.sections.emplace_back(testInfo.test_case_name());
            }
            if (!std::string(testInfo.name()).empty())
            {
                currentTest.sections.emplace_back(testInfo.name());
            }

            ApprovalTests::FrameworkIntegrations::setCurrentTest(&currentTest);
            ApprovalTests::FrameworkIntegrations::setTestPassedNotification(
                []() { EXPECT_TRUE(true); });
        }